

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTest::AssertParse(DyndepParserTest *this,char *input)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string err;
  DyndepParser parser;
  char *input_local;
  DyndepParserTest *this_local;
  
  DyndepParser::DyndepParser
            ((DyndepParser *)((long)&err.field_2 + 8),&this->state_,(FileReader *)&this->fs_,
             &this->dyndep_file_);
  std::__cxx11::string::string((string *)local_f8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,input,&local_119);
  bVar2 = DyndepParser::ParseTest
                    ((DyndepParser *)((long)&err.field_2 + 8),&local_118,(string *)local_f8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0x1f,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
                     ,0x20,"\"\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_f8);
  DyndepParser::~DyndepParser((DyndepParser *)((long)&err.field_2 + 8));
  return;
}

Assistant:

void AssertParse(const char* input) {
    DyndepParser parser(&state_, &fs_, &dyndep_file_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
  }